

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_primitives.cpp
# Opt level: O0

string * __thiscall
editor::figures::Polygon::get_representation_abi_cxx11_
          (string *__return_storage_ptr__,Polygon *this)

{
  bool bVar1;
  reference pCVar2;
  ostream *poVar3;
  Coordinate *point;
  iterator __end2;
  iterator __begin2;
  vector<editor::Coordinate,_std::allocator<editor::Coordinate>_> *__range2;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  Polygon *local_18;
  Polygon *this_local;
  
  local_18 = this;
  this_local = (Polygon *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"polygon: ");
  __end2 = std::vector<editor::Coordinate,_std::allocator<editor::Coordinate>_>::begin
                     (&this->points);
  point = (Coordinate *)
          std::vector<editor::Coordinate,_std::allocator<editor::Coordinate>_>::end(&this->points);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<editor::Coordinate_*,_std::vector<editor::Coordinate,_std::allocator<editor::Coordinate>_>_>
                                *)&point);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<editor::Coordinate_*,_std::vector<editor::Coordinate,_std::allocator<editor::Coordinate>_>_>
             ::operator*(&__end2);
    poVar3 = std::operator<<(local_190,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pCVar2->x);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pCVar2->y);
    std::operator<<(poVar3,") ");
    __gnu_cxx::
    __normal_iterator<editor::Coordinate_*,_std::vector<editor::Coordinate,_std::allocator<editor::Coordinate>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Polygon::get_representation() {
        std::stringstream ss;
        ss << "polygon: ";
        for (const auto& point: points)
            ss << "(" << point.x << "," << point.y << ") ";
        return ss.str();
    }